

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

SchemaResolution
avro::anon_unknown_30::checkUnionMatch(NodePtr *writer,NodePtr *reader,size_t *index)

{
  int iVar1;
  int iVar2;
  SchemaResolution SVar3;
  type pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type pNVar5;
  ulong *in_RDX;
  shared_ptr<avro::Node> *in_RSI;
  shared_ptr<avro::Node> *in_RDI;
  SchemaResolution newMatch;
  NodePtr *leaf;
  size_t i;
  size_t leaves;
  SchemaResolution bestMatch;
  ulong local_30;
  SchemaResolution local_1c;
  
  local_1c = RESOLVE_NO_MATCH;
  *in_RDX = 0;
  pNVar4 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  iVar1 = (*pNVar4->_vptr_Node[4])();
  local_30 = 0;
  while( true ) {
    if (CONCAT44(extraout_var,iVar1) <= local_30) {
      return local_1c;
    }
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
    iVar2 = (*pNVar4->_vptr_Node[5])(pNVar4,local_30 & 0xffffffff);
    pNVar4 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
    pNVar5 = boost::shared_ptr<avro::Node>::operator*
                       ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_00,iVar2));
    SVar3 = (*pNVar4->_vptr_Node[0xc])(pNVar4,pNVar5);
    if (SVar3 == RESOLVE_MATCH) break;
    if (local_1c == RESOLVE_NO_MATCH) {
      *in_RDX = local_30;
      local_1c = SVar3;
    }
    local_30 = local_30 + 1;
  }
  *in_RDX = local_30;
  return RESOLVE_MATCH;
}

Assistant:

SchemaResolution    
checkUnionMatch(const NodePtr &writer, const NodePtr &reader, size_t &index)
{
    SchemaResolution bestMatch = RESOLVE_NO_MATCH;
 
    index = 0;
    size_t leaves = reader->leaves();

    for(size_t i=0; i < leaves; ++i) {

        const NodePtr &leaf = reader->leafAt(i);
        SchemaResolution newMatch = writer->resolve(*leaf);

        if(newMatch == RESOLVE_MATCH) {
            bestMatch = newMatch;
            index = i;
            break;
        }
        if(bestMatch == RESOLVE_NO_MATCH) {
            bestMatch = newMatch;
            index = i;
        }
    }

    return bestMatch;
}